

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.cpp
# Opt level: O0

Spectrum __thiscall
CMU462::GlassBSDF::sample_f(GlassBSDF *this,Vector3D *wo,Vector3D *wi,float *pdf)

{
  undefined1 auVar1 [16];
  int iVar2;
  float *pfVar3;
  float *in_RCX;
  Vector3D *in_RDX;
  long in_RSI;
  Spectrum *in_RDI;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Spectrum SVar4;
  float Fr;
  float r_perpendicular;
  float r_parallel;
  float cos_theta_t;
  float cos_theta_i;
  float nt;
  float ni;
  bool external;
  Vector3D wi_refract;
  float s;
  undefined1 in_stack_fffffffffffffef8 [16];
  Spectrum *this_00;
  float in_stack_ffffffffffffff14;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  byte local_49;
  Vector3D local_48;
  float *local_30;
  Vector3D *local_28;
  long local_20;
  undefined8 local_c;
  float local_4;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  Vector3D::Vector3D(&local_48);
  local_49 = (**(code **)(*(long *)in_RDI + 0x28))(in_RDI[1].b,in_RDI,local_20,&local_48);
  local_49 = local_49 & 1;
  s = in_stack_fffffffffffffef8._4_4_;
  this_00 = in_stack_fffffffffffffef8._8_8_;
  if (local_49 == 0) {
    (**(code **)(*(long *)in_RDI + 0x20))(in_RDI,local_20,local_28);
    *local_30 = 1.0;
    abs_cos_theta(local_28);
    SVar4 = Spectrum::operator*(this_00,s);
    local_4 = SVar4.b;
    local_c = SVar4._0_8_;
  }
  else {
    if (*(double *)(local_20 + 0x10) < 0.0) {
      local_50 = in_RDI[1].b;
      local_54 = 1.0;
    }
    else {
      local_50 = 1.0;
      local_54 = in_RDI[1].b;
    }
    iVar2 = (int)local_48.z;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    local_5c = (float)iVar2;
    iVar2 = (int)*(double *)(local_20 + 0x10);
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    local_58 = (float)iVar2;
    local_60 = (local_54 * local_58 + -(local_50 * local_5c)) /
               (local_54 * local_58 + local_50 * local_5c);
    local_64 = (local_50 * local_58 + -(local_54 * local_5c)) /
               (local_50 * local_58 + local_54 * local_5c);
    local_68 = (local_60 * local_60 + local_64 * local_64) * 0.5;
    local_6c = 1.0;
    local_70 = 0.0;
    pfVar3 = std::max<float>(&local_70,&local_68);
    pfVar3 = std::min<float>(&local_6c,pfVar3);
    local_68 = *pfVar3;
    iVar2 = rand();
    if (local_68 <= (float)iVar2 / 2.1474836e+09) {
      local_28->z = local_48.z;
      local_28->x = local_48.x;
      local_28->y = local_48.y;
      *local_30 = 1.0 - local_68;
      SVar4 = Spectrum::operator*(this_00,s);
      auVar1._8_4_ = extraout_XMM0_Dc;
      auVar1._0_8_ = SVar4._0_8_;
      auVar1._12_4_ = extraout_XMM0_Dd;
      SVar4 = Spectrum::operator*(auVar1._8_8_,SVar4.g);
      local_4 = SVar4.b;
      local_c = SVar4._0_8_;
    }
    else {
      (**(code **)(*(long *)in_RDI + 0x20))(in_RDI,local_20,local_28);
      *local_30 = local_68;
      CMU462::operator*(in_stack_ffffffffffffff14,in_RDI);
      abs_cos_theta(local_28);
      SVar4 = Spectrum::operator*(this_00,s);
      local_4 = SVar4.b;
      local_c = SVar4._0_8_;
    }
  }
  SVar4.b = local_4;
  SVar4.r = (float)(undefined4)local_c;
  SVar4.g = (float)local_c._4_4_;
  return SVar4;
}

Assistant:

Spectrum GlassBSDF::sample_f(const Vector3D& wo, Vector3D* wi, float* pdf) {
	// TODO (PathTracer):
	Vector3D wi_refract;
	bool external = refract(wo, &wi_refract, ior);
	if (external) {
		float ni, nt, cos_theta_i, cos_theta_t;
		if (wo.z >= 0) {
			ni = 1.0;
			nt = ior;
		}
		else {
			ni = ior;
			nt = 1.0;
		}
		cos_theta_t = abs(wi_refract.z);
		cos_theta_i = abs(wo.z);

		// Compute Fresnel coefficient.
		float r_parallel = (nt* cos_theta_i - ni * cos_theta_t) / (nt * cos_theta_i + ni * cos_theta_t);
		float r_perpendicular = (ni* cos_theta_i - nt * cos_theta_t) / (ni * cos_theta_i + nt * cos_theta_t);
		float Fr = 0.5f*(r_parallel*r_parallel + r_perpendicular * r_perpendicular);
		Fr = std::min(1.0f, std::max(0.0f, Fr));

		// decide either reflect or refract based on it
		if ((double(rand()) / RAND_MAX) < Fr) {
			reflect(wo, wi);
			*pdf = Fr;
			return Fr * reflectance * (1.0 / abs_cos_theta(*wi));
		}
		else {
			*wi = wi_refract;
			*pdf = 1.0f - Fr;
			return transmittance * (nt * nt / ni / ni / cos_theta_i) * (1.0f - Fr);
		}
	}
	else {
		reflect(wo, wi);
		*pdf = 1.0f;
		return reflectance * (1.0 / abs_cos_theta(*wi));
	}
}